

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

CaseStatementSyntax * __thiscall
slang::parsing::Parser::parseCaseStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes,Token uniqueOrPriority,
          Token caseKeyword)

{
  Token caseKeyword_00;
  Token openParen;
  Token closeParen;
  Token matchesOrInside;
  Token uniqueOrPriority_00;
  bool bVar1;
  undefined1 tripleAnd [16];
  bool bVar2;
  int iVar3;
  SourceLocation SVar4;
  Diagnostic *pDVar5;
  DefaultCaseItemSyntax *pDVar6;
  ExpressionSyntax *pEVar7;
  StatementSyntax *pSVar8;
  PatternCaseItemSyntax *pPVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StandardCaseItemSyntax *pSVar10;
  undefined4 extraout_var_01;
  CaseStatementSyntax *pCVar11;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *pIVar12;
  Info *extraout_RDX_03;
  Info *extraout_RDX_04;
  Info *extraout_RDX_05;
  Info *extraout_RDX_06;
  Info *extraout_RDX_07;
  Info *extraout_RDX_08;
  TokenKind TVar13;
  TokenKind TVar14;
  SyntaxFactory *pSVar15;
  Token TVar16;
  string_view sVar17;
  Token TVar18;
  bool errored;
  SourceLocation lastDefault;
  Token colon;
  SmallVector<slang::syntax::CaseItemSyntax_*,_5UL> itemBuffer;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  SourceLocation local_278;
  Token local_270;
  Token local_260;
  SyntaxFactory *local_250;
  PatternSyntax *local_248;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_240;
  ulong local_230;
  undefined8 uStack_228;
  undefined8 local_218;
  uint local_204;
  SmallVectorBase<slang::syntax::CaseItemSyntax_*> local_200 [2];
  Token local_1c0;
  undefined1 local_1b0 [24];
  undefined1 auStack_198 [24];
  __extent_storage<18446744073709551615UL> local_180;
  ExpressionSyntax *local_d8;
  NamedLabelSyntax *local_d0;
  undefined8 local_c8;
  Info *local_c0;
  Info *local_b8;
  undefined8 local_b0;
  Info *local_a8;
  undefined8 local_a0;
  pointer local_98;
  Info *local_90;
  Token local_88;
  undefined8 local_78;
  Info *pIStack_70;
  undefined8 local_68;
  Info *pIStack_60;
  Token local_58;
  undefined8 local_48;
  Info *pIStack_40;
  
  local_c0 = uniqueOrPriority.info;
  local_c8 = uniqueOrPriority._0_8_;
  local_90 = (Info *)attributes._M_extent._M_extent_value;
  local_98 = attributes._M_ptr;
  local_d0 = label;
  TVar16 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_a8 = TVar16.info;
  local_a0 = TVar16._0_8_;
  local_d8 = parseExpression(this);
  TVar16 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  local_b8 = TVar16.info;
  local_b0 = TVar16._0_8_;
  Token::Token(&local_1c0);
  local_200[0].data_ = (pointer)local_200[0].firstElement;
  local_200[0].len = 0;
  local_200[0].cap = 5;
  TVar16 = ParserBase::peek(&this->super_ParserBase);
  if (TVar16.kind == InsideKeyword) {
    local_1c0 = ParserBase::consume(&this->super_ParserBase);
    pSVar15 = &this->factory;
    local_278 = (SourceLocation)0x0;
    local_248 = (PatternSyntax *)CONCAT44(local_248._4_4_,(uint)caseKeyword.kind);
    bVar1 = false;
    local_250 = pSVar15;
    do {
      TVar16 = ParserBase::peek(&this->super_ParserBase);
      TVar14 = TVar16.kind;
      if ((TVar16._0_4_ & 0xffff) == 0x86) {
        if ((((ulong)local_278 & 0xfffffff) != 0) && (!bVar1)) {
          local_1b0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
          SVar4 = Token::location((Token *)local_1b0);
          pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar4);
          sVar17 = LexerFacts::getTokenKindText((TokenKind)local_248);
          Diagnostic::operator<<(pDVar5,sVar17);
          bVar1 = true;
          Diagnostic::addNote(pDVar5,(DiagCode)0xa0001,local_278);
        }
        local_1b0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        local_278 = Token::location((Token *)local_1b0);
        pDVar6 = parseDefaultCaseItem(this);
        local_1b0._0_8_ = pDVar6;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_200,
                   (CaseItemSyntax **)local_1b0);
        bVar2 = true;
      }
      else {
        bVar2 = syntax::SyntaxFacts::isPossibleValueRangeElement(TVar14);
        if (bVar2) {
          Token::Token(&local_270);
          local_1b0._8_8_ = 0;
          local_1b0._0_8_ = auStack_198;
          local_1b0._16_8_ = (SyntaxNode *)0x8;
          local_260 = ParserBase::peek(&this->super_ParserBase);
          bVar2 = syntax::SyntaxFacts::isEndOfCaseItem(local_260.kind);
          if (bVar2) {
            bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
            if (!bVar2) {
              SVar4 = Token::location(&local_260);
              ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x580005,SVar4);
            }
            local_270 = ParserBase::expect(&this->super_ParserBase,Colon);
LAB_001efe5c:
            pIVar12 = local_270.info;
          }
          else {
            bVar2 = syntax::SyntaxFacts::isPossibleValueRangeElement(local_260.kind);
            if (bVar2) {
              do {
                pEVar7 = parseValueRangeElement
                                   (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
                local_240._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar7;
                local_230 = CONCAT71(local_230._1_7_,1);
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1b0,
                           (TokenOrSyntax *)&local_240._M_first);
                TVar18 = ParserBase::peek(&this->super_ParserBase);
                TVar13 = TVar18.kind;
                bVar2 = syntax::SyntaxFacts::isEndOfCaseItem(TVar13);
                iVar3 = 3;
                pIVar12 = extraout_RDX;
                if (TVar13 != EndOfFile && !bVar2) {
                  if (TVar13 != Comma) {
                    ParserBase::expect(&this->super_ParserBase,Comma);
                    do {
                      bVar2 = ParserBase::
                              skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                        (&this->super_ParserBase,(DiagCode)0x580005,false);
                      if (!bVar2) {
                        local_270 = ParserBase::expect(&this->super_ParserBase,Colon);
                        pIVar12 = local_270.info;
                        iVar3 = 1;
                        goto LAB_001effe9;
                      }
                      bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
                    } while (!bVar2);
                  }
                  local_240._M_first._M_storage =
                       (_Uninitialized<slang::parsing::Token,_true>)
                       ParserBase::expect(&this->super_ParserBase,Comma);
                  local_230 = local_230 & 0xffffffffffffff00;
                  SmallVectorBase<slang::syntax::TokenOrSyntax>::
                  emplace_back<slang::syntax::TokenOrSyntax>
                            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1b0,
                             (TokenOrSyntax *)&local_240._M_first);
                  TVar18 = ParserBase::peek(&this->super_ParserBase);
                  TVar13 = TVar18.kind;
                  bVar2 = syntax::SyntaxFacts::isEndOfCaseItem(TVar13);
                  if (TVar13 == EndOfFile || bVar2) {
                    ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                    pIVar12 = extraout_RDX_01;
                  }
                  else {
                    pIVar12 = extraout_RDX_00;
                    if (((local_260.kind != TVar13) || (local_260.info != TVar18.info)) ||
                       (bVar2 = ParserBase::
                                skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleValueRangeElement,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                          (&this->super_ParserBase,(DiagCode)0x580005,true),
                       pIVar12 = extraout_RDX_02, bVar2)) {
                      iVar3 = 0;
                      local_260 = TVar18;
                    }
                  }
                }
LAB_001effe9:
                pSVar15 = local_250;
              } while (iVar3 == 0);
              if (iVar3 == 3) {
                local_270 = ParserBase::expect(&this->super_ParserBase,Colon);
                goto LAB_001efe5c;
              }
            }
            else {
              ParserBase::reportMissingList
                        (&this->super_ParserBase,local_260,Colon,&local_270,(DiagCode)0x580005);
              pIVar12 = extraout_RDX_03;
              pSVar15 = local_250;
            }
          }
          iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1b0,
                             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar12)
          ;
          TVar18 = local_270;
          local_218 = CONCAT44(extraout_var,iVar3);
          local_240._8_4_ = 3;
          local_230 = 0;
          uStack_228 = 0;
          local_240._M_rest =
               (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002f8c68;
          pSVar8 = parseStatement(this,true,false);
          pSVar10 = syntax::SyntaxFactory::standardCaseItem
                              (pSVar15,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                                       &local_240._M_first,TVar18,&pSVar8->super_SyntaxNode);
          if ((pointer)local_1b0._0_8_ != (pointer)auStack_198) {
            operator_delete((void *)local_1b0._0_8_);
          }
          local_1b0._0_8_ = pSVar10;
          SmallVectorBase<slang::syntax::CaseItemSyntax*>::
          emplace_back<slang::syntax::CaseItemSyntax*>
                    ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_200,
                     (CaseItemSyntax **)local_1b0);
          TVar18 = ParserBase::peek(&this->super_ParserBase);
          bVar2 = true;
          if (TVar16.info == TVar18.info && TVar14 == TVar18.kind) {
            ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
          }
        }
        else if ((TVar14 == EndOfFile) || (bVar2 = syntax::SyntaxFacts::isEndKeyword(TVar14), bVar2)
                ) {
          bVar2 = false;
        }
        else {
          bVar2 = true;
          ParserBase::skipToken
                    (&this->super_ParserBase,
                     (optional<slang::DiagCode>)((uint6)(byte)~bVar1 << 0x20 | 0x310005));
          bVar1 = true;
        }
      }
    } while (bVar2);
  }
  else if (TVar16.kind == MatchesKeyword) {
    local_1c0 = ParserBase::consume(&this->super_ParserBase);
    local_250 = &this->factory;
    local_278 = (SourceLocation)0x0;
    local_204 = (uint)caseKeyword.kind;
    bVar1 = false;
    do {
      TVar16 = ParserBase::peek(&this->super_ParserBase);
      TVar14 = TVar16.kind;
      if ((TVar16._0_4_ & 0xffff) == 0x86) {
        if ((((ulong)local_278 & 0xfffffff) != 0) && (!bVar1)) {
          local_1b0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
          SVar4 = Token::location((Token *)local_1b0);
          pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar4);
          sVar17 = LexerFacts::getTokenKindText((TokenKind)local_204);
          Diagnostic::operator<<(pDVar5,sVar17);
          bVar1 = true;
          Diagnostic::addNote(pDVar5,(DiagCode)0xa0001,local_278);
        }
        local_1b0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        local_278 = Token::location((Token *)local_1b0);
        pDVar6 = parseDefaultCaseItem(this);
        local_1b0._0_8_ = pDVar6;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_200,
                   (CaseItemSyntax **)local_1b0);
        bVar2 = true;
      }
      else {
        bVar2 = syntax::SyntaxFacts::isPossiblePattern(TVar14);
        if (bVar2) {
          local_248 = parsePattern(this);
          Token::Token((Token *)local_1b0);
          bVar2 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
          if (bVar2) {
            local_1b0._0_16_ = (undefined1  [16])ParserBase::consume(&this->super_ParserBase);
            pEVar7 = parseExpression(this);
          }
          else {
            pEVar7 = (ExpressionSyntax *)0x0;
          }
          local_240._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Colon);
          tripleAnd = local_1b0._0_16_;
          pSVar8 = parseStatement(this,true,false);
          pPVar9 = syntax::SyntaxFactory::patternCaseItem
                             (local_250,local_248,(Token)tripleAnd,pEVar7,
                              (Token)local_240._M_first._M_storage,pSVar8);
          local_1b0._0_8_ = pPVar9;
          SmallVectorBase<slang::syntax::CaseItemSyntax*>::
          emplace_back<slang::syntax::CaseItemSyntax*>
                    ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_200,
                     (CaseItemSyntax **)local_1b0);
          TVar18 = ParserBase::peek(&this->super_ParserBase);
          bVar2 = true;
          if (TVar16.info == TVar18.info && TVar14 == TVar18.kind) {
            ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
          }
        }
        else if ((TVar14 == EndOfFile) || (bVar2 = syntax::SyntaxFacts::isEndKeyword(TVar14), bVar2)
                ) {
          bVar2 = false;
        }
        else {
          bVar2 = true;
          ParserBase::skipToken
                    (&this->super_ParserBase,
                     (optional<slang::DiagCode>)((uint6)(byte)~bVar1 << 0x20 | 0x310005));
          bVar1 = true;
        }
      }
    } while (bVar2);
  }
  else {
    pSVar15 = &this->factory;
    local_278 = (SourceLocation)0x0;
    local_248 = (PatternSyntax *)CONCAT44(local_248._4_4_,(uint)caseKeyword.kind);
    bVar1 = false;
    local_250 = pSVar15;
    do {
      TVar16 = ParserBase::peek(&this->super_ParserBase);
      TVar14 = TVar16.kind;
      if ((TVar16._0_4_ & 0xffff) == 0x86) {
        if ((((ulong)local_278 & 0xfffffff) != 0) && (!bVar1)) {
          local_1b0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
          SVar4 = Token::location((Token *)local_1b0);
          pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar4);
          sVar17 = LexerFacts::getTokenKindText((TokenKind)local_248);
          Diagnostic::operator<<(pDVar5,sVar17);
          bVar1 = true;
          Diagnostic::addNote(pDVar5,(DiagCode)0xa0001,local_278);
        }
        local_1b0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
        local_278 = Token::location((Token *)local_1b0);
        pDVar6 = parseDefaultCaseItem(this);
        local_1b0._0_8_ = pDVar6;
        SmallVectorBase<slang::syntax::CaseItemSyntax*>::
        emplace_back<slang::syntax::CaseItemSyntax*>
                  ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_200,
                   (CaseItemSyntax **)local_1b0);
        bVar2 = true;
      }
      else {
        bVar2 = syntax::SyntaxFacts::isPossibleExpression(TVar14);
        if (bVar2) {
          Token::Token(&local_270);
          local_1b0._8_8_ = 0;
          local_1b0._0_8_ = auStack_198;
          local_1b0._16_8_ = (SyntaxNode *)0x8;
          local_260 = ParserBase::peek(&this->super_ParserBase);
          bVar2 = syntax::SyntaxFacts::isEndOfCaseItem(local_260.kind);
          if (bVar2) {
            bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
            if (!bVar2) {
              SVar4 = Token::location(&local_260);
              ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar4);
            }
            local_270 = ParserBase::expect(&this->super_ParserBase,Colon);
LAB_001f0318:
            pIVar12 = local_270.info;
          }
          else {
            bVar2 = syntax::SyntaxFacts::isPossibleExpressionOrComma(local_260.kind);
            if (bVar2) {
              do {
                pEVar7 = parseExpression(this);
                local_240._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar7;
                local_230 = CONCAT71(local_230._1_7_,1);
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1b0,
                           (TokenOrSyntax *)&local_240._M_first);
                TVar18 = ParserBase::peek(&this->super_ParserBase);
                TVar13 = TVar18.kind;
                bVar2 = syntax::SyntaxFacts::isEndOfCaseItem(TVar13);
                iVar3 = 3;
                pIVar12 = extraout_RDX_04;
                if (TVar13 != EndOfFile && !bVar2) {
                  if (TVar13 != Comma) {
                    ParserBase::expect(&this->super_ParserBase,Comma);
                    do {
                      bVar2 = ParserBase::
                              skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                        (&this->super_ParserBase,(DiagCode)0x10001,false);
                      if (!bVar2) {
                        local_270 = ParserBase::expect(&this->super_ParserBase,Colon);
                        pIVar12 = local_270.info;
                        iVar3 = 1;
                        goto LAB_001f04a3;
                      }
                      bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
                    } while (!bVar2);
                  }
                  local_240._M_first._M_storage =
                       (_Uninitialized<slang::parsing::Token,_true>)
                       ParserBase::expect(&this->super_ParserBase,Comma);
                  local_230 = local_230 & 0xffffffffffffff00;
                  SmallVectorBase<slang::syntax::TokenOrSyntax>::
                  emplace_back<slang::syntax::TokenOrSyntax>
                            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1b0,
                             (TokenOrSyntax *)&local_240._M_first);
                  TVar18 = ParserBase::peek(&this->super_ParserBase);
                  TVar13 = TVar18.kind;
                  bVar2 = syntax::SyntaxFacts::isEndOfCaseItem(TVar13);
                  if (TVar13 == EndOfFile || bVar2) {
                    ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                    pIVar12 = extraout_RDX_06;
                  }
                  else {
                    pIVar12 = extraout_RDX_05;
                    if (((local_260.kind != TVar13) || (local_260.info != TVar18.info)) ||
                       (bVar2 = ParserBase::
                                skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfCaseItem>
                                          (&this->super_ParserBase,(DiagCode)0x10001,true),
                       pIVar12 = extraout_RDX_07, bVar2)) {
                      iVar3 = 0;
                      local_260 = TVar18;
                    }
                  }
                }
LAB_001f04a3:
                pSVar15 = local_250;
              } while (iVar3 == 0);
              if (iVar3 == 3) {
                local_270 = ParserBase::expect(&this->super_ParserBase,Colon);
                goto LAB_001f0318;
              }
            }
            else {
              ParserBase::reportMissingList
                        (&this->super_ParserBase,local_260,Colon,&local_270,(DiagCode)0x10001);
              pIVar12 = extraout_RDX_08;
              pSVar15 = local_250;
            }
          }
          iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1b0,
                             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar12)
          ;
          TVar18 = local_270;
          local_218 = CONCAT44(extraout_var_00,iVar3);
          local_240._8_4_ = 3;
          local_230 = 0;
          uStack_228 = 0;
          local_240._M_rest =
               (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002f8c68;
          pSVar8 = parseStatement(this,true,false);
          pSVar10 = syntax::SyntaxFactory::standardCaseItem
                              (pSVar15,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                                       &local_240._M_first,TVar18,&pSVar8->super_SyntaxNode);
          if ((pointer)local_1b0._0_8_ != (pointer)auStack_198) {
            operator_delete((void *)local_1b0._0_8_);
          }
          local_1b0._0_8_ = pSVar10;
          SmallVectorBase<slang::syntax::CaseItemSyntax*>::
          emplace_back<slang::syntax::CaseItemSyntax*>
                    ((SmallVectorBase<slang::syntax::CaseItemSyntax*> *)local_200,
                     (CaseItemSyntax **)local_1b0);
          TVar18 = ParserBase::peek(&this->super_ParserBase);
          bVar2 = true;
          if (TVar16.info == TVar18.info && TVar14 == TVar18.kind) {
            ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
          }
        }
        else if ((TVar14 == EndOfFile) || (bVar2 = syntax::SyntaxFacts::isEndKeyword(TVar14), bVar2)
                ) {
          bVar2 = false;
        }
        else {
          bVar2 = true;
          ParserBase::skipToken
                    (&this->super_ParserBase,
                     (optional<slang::DiagCode>)((uint6)(byte)~bVar1 << 0x20 | 0x310005));
          bVar1 = true;
        }
      }
    } while (bVar2);
  }
  if (local_200[0].len == 0 && !bVar1) {
    SVar4 = Token::location(&caseKeyword);
    pDVar5 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x50005,SVar4);
    sVar17 = LexerFacts::getTokenKindText(caseKeyword.kind);
    Diagnostic::operator<<(pDVar5,sVar17);
  }
  TVar18 = ParserBase::expect(&this->super_ParserBase,EndCaseKeyword);
  TVar16 = local_1c0;
  local_1b0._8_4_ = 1;
  local_1b0._16_8_ = (SyntaxNode *)0x0;
  auStack_198._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  auStack_198._8_8_ = local_90;
  auStack_198._16_8_ = local_98;
  local_180._M_extent_value = (size_t)local_90;
  local_1b0._0_8_ = &PTR_getChild_002f85e0;
  local_48 = CONCAT62(caseKeyword._2_6_,caseKeyword.kind);
  pIStack_40 = caseKeyword.info;
  local_68 = local_a0;
  pIStack_60 = local_a8;
  local_78 = local_b0;
  pIStack_70 = local_b8;
  local_58.kind = local_1c0.kind;
  local_58._2_1_ = local_1c0._2_1_;
  local_58.numFlags.raw = local_1c0.numFlags.raw;
  local_58.rawLen = local_1c0.rawLen;
  local_58.info = local_1c0.info;
  local_1c0 = TVar16;
  iVar3 = SmallVectorBase<slang::syntax::CaseItemSyntax_*>::copy
                    (local_200,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                     (EVP_PKEY_CTX *)TVar18.info);
  local_218 = CONCAT44(extraout_var_01,iVar3);
  local_240._8_4_ = 1;
  local_230 = 0;
  uStack_228 = 0;
  local_240._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002f8a78;
  uniqueOrPriority_00.info = local_c0;
  uniqueOrPriority_00.kind = (undefined2)local_c8;
  uniqueOrPriority_00._2_1_ = local_c8._2_1_;
  uniqueOrPriority_00.numFlags.raw = local_c8._3_1_;
  uniqueOrPriority_00.rawLen = local_c8._4_4_;
  caseKeyword_00.info = pIStack_40;
  caseKeyword_00.kind = (undefined2)local_48;
  caseKeyword_00._2_1_ = local_48._2_1_;
  caseKeyword_00.numFlags.raw = local_48._3_1_;
  caseKeyword_00.rawLen = local_48._4_4_;
  openParen.info = pIStack_60;
  openParen.kind = (undefined2)local_68;
  openParen._2_1_ = local_68._2_1_;
  openParen.numFlags.raw = local_68._3_1_;
  openParen.rawLen = local_68._4_4_;
  closeParen.info = pIStack_70;
  closeParen.kind = (undefined2)local_78;
  closeParen._2_1_ = local_78._2_1_;
  closeParen.numFlags.raw = local_78._3_1_;
  closeParen.rawLen = local_78._4_4_;
  matchesOrInside.info = local_58.info;
  matchesOrInside.kind = local_58.kind;
  matchesOrInside._2_1_ = local_58._2_1_;
  matchesOrInside.numFlags.raw = local_58.numFlags.raw;
  matchesOrInside.rawLen = local_58.rawLen;
  local_88 = TVar18;
  pCVar11 = syntax::SyntaxFactory::caseStatement
                      (&this->factory,local_d0,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_1b0,
                       uniqueOrPriority_00,caseKeyword_00,openParen,local_d8,closeParen,
                       matchesOrInside,
                       (SyntaxList<slang::syntax::CaseItemSyntax> *)&local_240._M_first,TVar18);
  if (local_200[0].data_ != (pointer)local_200[0].firstElement) {
    operator_delete(local_200[0].data_);
  }
  return pCVar11;
}

Assistant:

CaseStatementSyntax& Parser::parseCaseStatement(NamedLabelSyntax* label, AttrList attributes,
                                                Token uniqueOrPriority, Token caseKeyword) {
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& caseExpr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);

    Token matchesOrInside;
    SmallVector<CaseItemSyntax*> itemBuffer;
    bool errored = false;

    switch (peek().kind) {
        case TokenKind::MatchesKeyword:
            // pattern matching case statement
            matchesOrInside = consume();
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer, [](auto kind) { return isPossiblePattern(kind); },
                [this] {
                    auto& pattern = parsePattern();
                    Token tripleAnd;
                    ExpressionSyntax* patternExpr = nullptr;

                    if (peek(TokenKind::TripleAnd)) {
                        tripleAnd = consume();
                        patternExpr = &parseExpression();
                    }

                    auto colon = expect(TokenKind::Colon);
                    return &factory.patternCaseItem(pattern, tripleAnd, patternExpr, colon,
                                                    parseStatement());
                });
            break;
        case TokenKind::InsideKeyword:
            // range checking case statement
            matchesOrInside = consume();
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer,
                [](auto kind) { return isPossibleValueRangeElement(kind); },
                [this] {
                    Token colon;
                    SmallVector<TokenOrSyntax, 8> buffer;

                    parseList<isPossibleValueRangeElement, isEndOfCaseItem>(
                        buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                        diag::ExpectedValueRangeElement,
                        [this] { return &parseValueRangeElement(); });
                    return &factory.standardCaseItem(buffer.copy(alloc), colon, parseStatement());
                });
            break;
        default:
            // normal case statement
            errored = parseCaseItems(
                caseKeyword.kind, itemBuffer, [](auto kind) { return isPossibleExpression(kind); },
                [this] {
                    Token colon;
                    SmallVector<TokenOrSyntax, 8> buffer;

                    parseList<isPossibleExpressionOrComma, isEndOfCaseItem>(
                        buffer, TokenKind::Colon, TokenKind::Comma, colon, RequireItems::True,
                        diag::ExpectedExpression, [this] { return &parseExpression(); });
                    return &factory.standardCaseItem(buffer.copy(alloc), colon, parseStatement());
                });
            break;
    }

    if (itemBuffer.empty() && !errored) {
        addDiag(diag::CaseStatementEmpty, caseKeyword.location())
            << LexerFacts::getTokenKindText(caseKeyword.kind);
    }

    auto endcase = expect(TokenKind::EndCaseKeyword);
    return factory.caseStatement(label, attributes, uniqueOrPriority, caseKeyword, openParen,
                                 caseExpr, closeParen, matchesOrInside, itemBuffer.copy(alloc),
                                 endcase);
}